

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atom.cpp
# Opt level: O1

Element_p __thiscall indigox::Atom::GetElement(Atom *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  element_type *in_RDI;
  Element_p EVar2;
  Element_p EVar3;
  
  (in_RDI->name_)._M_dataplus._M_p =
       (pointer)(this->element_).super___shared_ptr<indigox::Element,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr;
  p_Var1 = (this->element_).super___shared_ptr<indigox::Element,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (in_RDI->name_)._M_string_length = (size_type)p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    in_RDX._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&__libc_single_threaded;
    if (__libc_single_threaded != '\0') {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      EVar2.super___shared_ptr<indigox::Element,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&__libc_single_threaded;
      EVar2.super___shared_ptr<indigox::Element,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
      return (Element_p)EVar2.super___shared_ptr<indigox::Element,_(__gnu_cxx::_Lock_policy)2>;
    }
    LOCK();
    p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    UNLOCK();
  }
  EVar3.super___shared_ptr<indigox::Element,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       in_RDX._M_pi;
  EVar3.super___shared_ptr<indigox::Element,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (Element_p)EVar3.super___shared_ptr<indigox::Element,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Element_p Atom::GetElement() const { return element_; }